

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2d2edf::check<unsigned_int>(istream *is,uint c)

{
  undefined8 in_RAX;
  ostream *poVar1;
  uchar b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  std::istream::read((char *)is,(long)b);
  poVar1 = std::operator<<((ostream *)&std::cout,___cxa_end_catch + (*___cxa_end_catch == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (b == (uchar  [4])c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = unsigned int]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}